

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O2

void * __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC>::neighborSetOf
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC> *this,int idx)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  bitset<16000UL> *this_00;
  int i;
  ulong uVar3;
  
  this_00 = (bitset<16000UL> *)operator_new(2000);
  memset(this_00,0,2000);
  for (uVar3 = 0; pvVar1 = (this->super_KDefectiveMADEC).super_KDefectiveBase.from,
      piVar2 = pvVar1[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)pvVar1[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar3 = uVar3 + 1) {
    std::bitset<16000UL>::set(this_00,(long)piVar2[uVar3],true);
  }
  return this_00;
}

Assistant:

void* BitSetImplement<Bitset, Base>::neighborSetOf(int idx) {
	Bitset *__Nei__ = new Bitset();
	for (int i = 0; i < from[idx].size(); i++) {
		int to = from[idx][i];
		__Nei__ -> set(to);
	}
	return __Nei__;
}